

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleTargetMode(cmGetPropertyCommand *this)

{
  string *name;
  string *__lhs;
  bool bVar1;
  cmTarget *this_00;
  ostream *poVar2;
  cmMessenger *messenger;
  char *value;
  pointer value_00;
  ostringstream e;
  string sStack_1b8;
  string local_198 [11];
  
  if ((this->Name)._M_string_length == 0) {
    std::__cxx11::string::string
              ((string *)local_198,"not given name for TARGET scope.",(allocator *)&sStack_1b8);
    cmCommand::SetError(&this->super_cmCommand,local_198);
    std::__cxx11::string::~string((string *)local_198);
  }
  else {
    name = &this->Name;
    this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name,false);
    if (this_00 != (cmTarget *)0x0) {
      __lhs = &this->PropertyName;
      bVar1 = std::operator==(__lhs,"ALIASED_TARGET");
      if (bVar1) {
        bVar1 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
        if (bVar1) {
          value_00 = (this_00->Name)._M_dataplus._M_p;
        }
        else {
          value_00 = (char *)0x0;
        }
        StoreResult(this,value_00);
      }
      else {
        cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,(this->super_cmCommand).Makefile);
        messenger = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
        bVar1 = cmTargetPropertyComputer::PassesWhitelist
                          (this_00->TargetTypeValue,__lhs,messenger,(cmListFileBacktrace *)local_198
                          );
        if (bVar1) {
          value = cmTarget::GetComputedProperty
                            (this_00,__lhs,messenger,(cmListFileBacktrace *)local_198);
          if (value == (char *)0x0) {
            value = cmTarget::GetProperty(this_00,__lhs);
          }
        }
        else {
          value = (char *)0x0;
        }
        StoreResult(this,value);
        cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_198);
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar2 = std::operator<<((ostream *)local_198,"could not find TARGET ");
    poVar2 = std::operator<<(poVar2,(string *)name);
    std::operator<<(poVar2,".  Perhaps it has not yet been created.");
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(&this->super_cmCommand,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  }
  return false;
}

Assistant:

bool cmGetPropertyCommand::HandleTargetMode()
{
  if (this->Name.empty()) {
    this->SetError("not given name for TARGET scope.");
    return false;
  }

  if (cmTarget* target = this->Makefile->FindTargetToUse(this->Name)) {
    if (this->PropertyName == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(this->Name)) {
        return this->StoreResult(target->GetName().c_str());
      }
      return this->StoreResult(CM_NULLPTR);
    }
    const char* prop_cstr = CM_NULLPTR;
    cmListFileBacktrace bt = this->Makefile->GetBacktrace();
    cmMessenger* messenger = this->Makefile->GetMessenger();
    if (cmTargetPropertyComputer::PassesWhitelist(
          target->GetType(), this->PropertyName, messenger, bt)) {
      prop_cstr =
        target->GetComputedProperty(this->PropertyName, messenger, bt);
      if (!prop_cstr) {
        prop_cstr = target->GetProperty(this->PropertyName);
      }
    }
    return this->StoreResult(prop_cstr);
  }
  std::ostringstream e;
  e << "could not find TARGET " << this->Name
    << ".  Perhaps it has not yet been created.";
  this->SetError(e.str());
  return false;
}